

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O1

err_t bign96KeypairGen(octet *privkey,octet *pubkey,bign_params *params,gen_i rng,void *rng_state)

{
  bool_t bVar1;
  err_t eVar2;
  size_t sVar3;
  ec_o *ec;
  word *a;
  word *stack;
  word *b;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    eVar2 = 0x1f6;
    if (params->l == 0x60) {
      if (rng == (gen_i)0x0) {
        eVar2 = 0x130;
      }
      else {
        sVar3 = bign96Start_keep(bign96KeypairGen_deep);
        ec = (ec_o *)blobCreate(sVar3);
        if (ec == (ec_o *)0x0) {
          eVar2 = 0x6e;
        }
        else {
          eVar2 = bign96Start(ec,params);
          if (eVar2 == 0) {
            sVar3 = ec->f->n;
            bVar1 = memIsValid(privkey,0x18);
            eVar2 = 0x6d;
            if ((bVar1 != 0) && (bVar1 = memIsValid(pubkey,0x30), bVar1 != 0)) {
              a = (word *)((long)&(ec->hdr).keep + (ec->hdr).keep);
              bVar1 = zzRandNZMod(a,ec->f->mod,sVar3,rng,rng_state);
              if (bVar1 == 0) {
                eVar2 = 0x130;
              }
              else {
                b = a + sVar3;
                stack = b + sVar3 * 2;
                bVar1 = ecMulA(b,ec->base,ec,a,sVar3,stack);
                if (bVar1 == 0) {
                  eVar2 = 0x1f6;
                }
                else {
                  u64To(privkey,0x18,a);
                  (*ec->f->to)(pubkey,b,ec->f,stack);
                  (*ec->f->to)(pubkey + 0x18,b + sVar3,ec->f,stack);
                  eVar2 = 0;
                }
              }
            }
          }
          blobClose(ec);
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bign96KeypairGen(octet privkey[24], octet pubkey[48],
	const bign_params* params, gen_i rng, void* rng_state)
{
	err_t code;
	size_t n;
	// состояние
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	word* d;				/* [n] личный ключ */
	word* Q;				/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96KeypairGen_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(privkey, 24) || !memIsValid(pubkey, 48))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	Q = d + n;
	stack = Q + 2 * n;
	// d <-R {1,2,..., q - 1}
	if (!zzRandNZMod(d, ec->f->mod, n, rng, rng_state))
	{
		blobClose(state);
		return ERR_BAD_RNG;
	}
	// Q <- d G
	if (ecMulA(Q, ec->base, ec, d, n, stack))
	{
		// выгрузить ключи
		wwTo(privkey, 24, d);
		qrTo(pubkey, ecX(Q), ec->f, stack);
		qrTo(pubkey + 24, ecY(Q, n), ec->f, stack);
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}